

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tag.cpp
# Opt level: O0

void __thiscall jaegertracing::ThriftVisitor::setString(ThriftVisitor *this,string_view value)

{
  Tag *this_00;
  string local_40;
  ThriftVisitor *local_20;
  ThriftVisitor *this_local;
  string_view value_local;
  
  value_local.data_ = (char *)value.length_;
  this_local = (ThriftVisitor *)value.data_;
  local_20 = this;
  thrift::Tag::__set_vType(this->_tag,STRING);
  this_00 = this->_tag;
  opentracing::v3::string_view::operator_cast_to_string(&local_40,(string_view *)&this_local);
  thrift::Tag::__set_vStr(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void setString(opentracing::string_view value) const
    {
        _tag.__set_vType(thrift::TagType::STRING);
        _tag.__set_vStr(value);
    }